

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O0

void __thiscall
avro::RecordSkipper::RecordSkipper(RecordSkipper *this,ResolverFactory *factory,NodePtr *writer)

{
  int iVar1;
  int iVar2;
  type pNVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  shared_ptr<avro::Node> *in_RDX;
  NodePtr *in_RDI;
  ResolverFactory *unaff_retaddr;
  NodePtr *w;
  size_t i;
  size_t leaves;
  size_type in_stack_ffffffffffffff88;
  ptr_sequence_adapter<avro::Resolver,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
  *in_stack_ffffffffffffff90;
  shared_count *x;
  ulong local_38;
  NodePtr *writer_00;
  ptr_sequence_adapter<avro::Resolver,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
  *this_00;
  
  in_RDI->px = (element_type *)0x0;
  writer_00 = in_RDI;
  Resolver::Resolver((Resolver *)in_RDI);
  in_RDI->px = (element_type *)&PTR_parse_00311120;
  x = &in_RDI->pn;
  boost::ptr_vector<avro::Resolver,_boost::heap_clone_allocator,_void>::ptr_vector
            ((ptr_vector<avro::Resolver,_boost::heap_clone_allocator,_void> *)0x2ba0ba);
  pNVar3 = boost::shared_ptr<avro::Node>::operator->(in_RDX);
  iVar1 = (*pNVar3->_vptr_Node[4])();
  boost::
  ptr_sequence_adapter<avro::Resolver,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
  ::reserve(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  for (local_38 = 0; local_38 < CONCAT44(extraout_var,iVar1); local_38 = local_38 + 1) {
    pNVar3 = boost::shared_ptr<avro::Node>::operator->(in_RDX);
    iVar2 = (*pNVar3->_vptr_Node[5])(pNVar3,local_38 & 0xffffffff);
    this_00 = (ptr_sequence_adapter<avro::Resolver,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
               *)CONCAT44(extraout_var_00,iVar2);
    ResolverFactory::skipper(unaff_retaddr,writer_00);
    boost::
    ptr_sequence_adapter<avro::Resolver,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
    ::push_back(this_00,(value_type)x);
  }
  return;
}

Assistant:

RecordSkipper::RecordSkipper(ResolverFactory &factory, const NodePtr &writer) :
    Resolver() 
{
    size_t leaves = writer->leaves();
    resolvers_.reserve(leaves);
    for(size_t i = 0; i < leaves; ++i) {
        const NodePtr &w = writer->leafAt(i);
        resolvers_.push_back(factory.skipper(w));
    }
}